

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mock_gl_engine.cpp
# Opt level: O1

void __thiscall
polyscope::render::backend_openGL_mock::MockGLEngine::updateWindowSize
          (MockGLEngine *this,bool force)

{
  undefined3 in_register_00000031;
  
  if ((((CONCAT31(in_register_00000031,force) != 0) || (view::bufferWidth != 400)) ||
      (view::bufferHeight != 600)) || ((view::windowHeight != 600 || (view::windowWidth != 400)))) {
    requestRedraw();
    view::bufferWidth = 400;
    view::bufferHeight = 600;
    view::windowWidth = 400;
    view::windowHeight = 600;
  }
  return;
}

Assistant:

void MockGLEngine::updateWindowSize(bool force) {
  int newBufferWidth = 400;
  int newBufferHeight = 600;
  int newWindowWidth = 400;
  int newWindowHeight = 600;
  if (force || newBufferWidth != view::bufferWidth || newBufferHeight != view::bufferHeight ||
      newWindowHeight != view::windowHeight || newWindowWidth != view::windowWidth) {
    // Basically a resize callback
    requestRedraw();
    view::bufferWidth = newBufferWidth;
    view::bufferHeight = newBufferHeight;
    view::windowWidth = newWindowWidth;
    view::windowHeight = newWindowHeight;
  }
}